

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<false>::Operation<int,double,duckdb::QuantileDirect<int>>
          (Interpolator<false> *this,int *v_t,Vector *result,QuantileDirect<int> *accessor)

{
  undefined8 uVar1;
  QuantileCompare<duckdb::QuantileDirect<int>_> __comp;
  QuantileCompare<duckdb::QuantileDirect<int>_> __comp_00;
  QuantileCompare<duckdb::QuantileDirect<int>_> __comp_01;
  QuantileDirect<int> *in_RCX;
  long in_RSI;
  byte *in_RDI;
  undefined1 auVar2 [16];
  double hi;
  double lo;
  QuantileCompare<duckdb::QuantileDirect<int>_> comp;
  double local_a8;
  double local_a0 [8];
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffc0;
  QuantileDirect<int> *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  double local_8;
  
  QuantileCompare<duckdb::QuantileDirect<int>_>::QuantileCompare
            ((QuantileCompare<duckdb::QuantileDirect<int>_> *)&stack0xffffffffffffffc0,in_RCX,
             (bool)(*in_RDI & 1));
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x10)) {
    __comp.accessor_r = in_stack_ffffffffffffffc8;
    __comp.accessor_l = (QuantileDirect<int> *)in_stack_ffffffffffffffc0;
    __comp.desc = SUB81(in_stack_ffffffffffffffd0,0);
    __comp._17_7_ = SUB87(in_stack_ffffffffffffffd0,1);
    std::nth_element<int*,duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>
              ((int *)in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffa0,__comp);
    QuantileDirect<int>::operator()
              (in_RCX,(INPUT_TYPE_conflict1 *)(in_RSI + *(long *)(in_RDI + 0x10) * 4));
    local_8 = CastInterpolation::Cast<int,double>
                        ((int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    __comp_00.accessor_r = in_stack_ffffffffffffffc8;
    __comp_00.accessor_l = (QuantileDirect<int> *)in_stack_ffffffffffffffc0;
    __comp_00.desc = SUB81(in_stack_ffffffffffffffd0,0);
    __comp_00._17_7_ = SUB87(in_stack_ffffffffffffffd0,1);
    std::nth_element<int*,duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               __comp_00);
    __comp_01.accessor_r = in_stack_ffffffffffffffc8;
    __comp_01.accessor_l = (QuantileDirect<int> *)in_stack_ffffffffffffffc0;
    __comp_01.desc = SUB81(in_stack_ffffffffffffffd0,0);
    __comp_01._17_7_ = SUB87(in_stack_ffffffffffffffd0,1);
    std::nth_element<int*,duckdb::QuantileCompare<duckdb::QuantileDirect<int>>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               __comp_01);
    QuantileDirect<int>::operator()
              (in_RCX,(INPUT_TYPE_conflict1 *)(in_RSI + *(long *)(in_RDI + 0x10) * 4));
    local_a0[0] = CastInterpolation::Cast<int,double>
                            ((int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    QuantileDirect<int>::operator()
              (in_RCX,(INPUT_TYPE_conflict1 *)(in_RSI + *(long *)(in_RDI + 0x18) * 4));
    local_a8 = CastInterpolation::Cast<int,double>
                         ((int *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    uVar1 = *(undefined8 *)(in_RDI + 0x10);
    auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = CastInterpolation::Interpolate<double>
                        (local_a0,*(double *)(in_RDI + 8) -
                                  ((auVar2._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)),
                         &local_a8);
  }
  return local_8;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}